

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall
mkvmuxer::ContentEncoding::SetEncryptionID(ContentEncoding *this,uint8_t *id,uint64_t length)

{
  uint8_t *__dest;
  
  if (length != 0 && id != (uint8_t *)0x0) {
    if (this->enc_key_id_ != (uint8_t *)0x0) {
      operator_delete__(this->enc_key_id_);
    }
    __dest = (uint8_t *)operator_new__(length,(nothrow_t *)&std::nothrow);
    this->enc_key_id_ = __dest;
    if (__dest != (uint8_t *)0x0) {
      memcpy(__dest,id,length);
      this->enc_key_id_length_ = length;
    }
    return __dest != (uint8_t *)0x0;
  }
  return false;
}

Assistant:

bool ContentEncoding::SetEncryptionID(const uint8_t* id, uint64_t length) {
  if (!id || length < 1)
    return false;

  delete[] enc_key_id_;

  enc_key_id_ =
      new (std::nothrow) uint8_t[static_cast<size_t>(length)];  // NOLINT
  if (!enc_key_id_)
    return false;

  memcpy(enc_key_id_, id, static_cast<size_t>(length));
  enc_key_id_length_ = length;

  return true;
}